

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode Curl_ssl_session_create2
                   (void *sdata,size_t sdata_len,int ietf_tls_id,char *alpn,curl_off_t valid_until,
                   size_t earlydata_max,uchar *quic_tp,size_t quic_tp_len,
                   Curl_ssl_session **psession)

{
  Curl_ssl_session *obj;
  char *pcVar1;
  Curl_ssl_session *s;
  size_t earlydata_max_local;
  curl_off_t valid_until_local;
  char *alpn_local;
  int ietf_tls_id_local;
  size_t sdata_len_local;
  void *sdata_local;
  
  if ((sdata == (void *)0x0) || (sdata_len == 0)) {
    (*Curl_cfree)(sdata);
    sdata_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    *psession = (Curl_ssl_session *)0x0;
    obj = (Curl_ssl_session *)(*Curl_ccalloc)(1,0x60);
    if (obj == (Curl_ssl_session *)0x0) {
      (*Curl_cfree)(sdata);
      (*Curl_cfree)(quic_tp);
      sdata_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      obj->ietf_tls_id = ietf_tls_id;
      obj->valid_until = valid_until;
      obj->earlydata_max = earlydata_max;
      obj->sdata = sdata;
      obj->sdata_len = sdata_len;
      obj->quic_tp = quic_tp;
      obj->quic_tp_len = quic_tp_len;
      if (alpn != (char *)0x0) {
        pcVar1 = (*Curl_cstrdup)(alpn);
        obj->alpn = pcVar1;
        if (obj->alpn == (char *)0x0) {
          cf_ssl_scache_sesssion_ldestroy((void *)0x0,obj);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      *psession = obj;
      sdata_local._4_4_ = CURLE_OK;
    }
  }
  return sdata_local._4_4_;
}

Assistant:

CURLcode
Curl_ssl_session_create2(void *sdata, size_t sdata_len,
                         int ietf_tls_id, const char *alpn,
                         curl_off_t valid_until, size_t earlydata_max,
                         unsigned char *quic_tp, size_t quic_tp_len,
                         struct Curl_ssl_session **psession)
{
  struct Curl_ssl_session *s;

  if(!sdata || !sdata_len) {
    free(sdata);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  *psession = NULL;
  s = calloc(1, sizeof(*s));
  if(!s) {
    free(sdata);
    free(quic_tp);
    return CURLE_OUT_OF_MEMORY;
  }

  s->ietf_tls_id = ietf_tls_id;
  s->valid_until = valid_until;
  s->earlydata_max = earlydata_max;
  s->sdata = sdata;
  s->sdata_len = sdata_len;
  s->quic_tp = quic_tp;
  s->quic_tp_len = quic_tp_len;
  if(alpn) {
    s->alpn = strdup(alpn);
    if(!s->alpn) {
      cf_ssl_scache_sesssion_ldestroy(NULL, s);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *psession = s;
  return CURLE_OK;
}